

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

MAP_TYPE * duckdb::ModeStandard<int>::CreateEmpty(Allocator *param_1)

{
  MAP_TYPE *__s;
  
  __s = (MAP_TYPE *)operator_new(0x38);
  memset(__s,0,0x38);
  std::
  unordered_map<int,_duckdb::ModeAttr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>_>
  ::unordered_map((unordered_map<int,_duckdb::ModeAttr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>_>
                   *)0xb0dbf1);
  return __s;
}

Assistant:

static MAP_TYPE *CreateEmpty(Allocator &) {
		return new MAP_TYPE();
	}